

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineValidator.cpp
# Opt level: O1

Result * CoreML::validate(Result *__return_storage_ptr__,Model *spec,Pipeline *pipelineParams)

{
  RepeatedPtrField<CoreML::Specification::Model> *this;
  Rep *pRVar1;
  mapped_type pFVar2;
  Model *model_00;
  FeatureDescription *pFVar3;
  pointer pcVar4;
  bool bVar5;
  bool bVar6;
  uint uVar7;
  undefined1 *puVar8;
  mapped_type *ppFVar9;
  iterator iVar10;
  Type *pTVar11;
  Type *pTVar12;
  iterator iVar13;
  undefined8 *puVar14;
  long *plVar15;
  uint uVar16;
  ulong *puVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  void **ppvVar21;
  ulong uVar22;
  void **ppvVar23;
  uint uVar24;
  uint uVar25;
  undefined8 uVar26;
  _Alloc_hider _Var27;
  long lVar28;
  uint uVar29;
  long lVar30;
  string modelName;
  Model model;
  string __str;
  string __str_1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>_>
  typeTable;
  key_type local_188;
  string local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  TypeUnion local_108;
  size_t local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  Pipeline *local_b8;
  ulong local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  ulong *local_a0;
  long local_98;
  ulong local_90 [2];
  Model *local_80;
  void **local_78;
  void **local_70;
  undefined1 local_68 [32];
  float local_48;
  size_t local_40;
  __node_base_ptr p_Stack_38;
  
  local_b0 = (ulong)(uint)(pipelineParams->models_).super_RepeatedPtrFieldBase.current_size_;
  local_b8 = pipelineParams;
  if (local_b0 == 0) {
    local_68._0_8_ = local_68 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Pipeline must contain one or more models.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_68);
    if ((undefined1 *)local_68._0_8_ == local_68 + 0x10) {
      return __return_storage_ptr__;
    }
    operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
    return __return_storage_ptr__;
  }
  local_68._0_8_ = &p_Stack_38;
  local_68._8_8_ = 1;
  local_68._16_8_ = (_Hash_node_base *)0x0;
  local_68._24_8_ = 0;
  local_48 = 1.0;
  local_40 = 0;
  p_Stack_38 = (__node_base_ptr)0x0;
  puVar8 = (undefined1 *)spec->description_;
  if ((ModelDescription *)puVar8 == (ModelDescription *)0x0) {
    puVar8 = Specification::_ModelDescription_default_instance_;
  }
  pRVar1 = (((ModelDescription *)puVar8)->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar21 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar21 = (void **)0x0;
  }
  lVar30 = (long)(((ModelDescription *)puVar8)->input_).super_RepeatedPtrFieldBase.current_size_;
  local_80 = spec;
  if (lVar30 != 0) {
    lVar28 = 0;
    do {
      pFVar2 = *(mapped_type *)((long)ppvVar21 + lVar28);
      ppFVar9 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)local_68,
                             (key_type *)
                             ((ulong)(pFVar2->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      *ppFVar9 = pFVar2;
      lVar28 = lVar28 + 8;
    } while (lVar30 * 8 != lVar28);
  }
  pRVar1 = (local_b8->models_).super_RepeatedPtrFieldBase.rep_;
  ppvVar21 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar21 = (void **)0x0;
  }
  lVar30 = (long)(local_b8->models_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar30 != 0) {
    local_78 = ppvVar21 + lVar30;
    local_a8 = &(__return_storage_ptr__->m_message).field_2;
    do {
      paVar19 = &local_148.field_2;
      model_00 = (Model *)*ppvVar21;
      puVar8 = (undefined1 *)model_00->description_;
      if ((ModelDescription *)puVar8 == (ModelDescription *)0x0) {
        puVar8 = Specification::_ModelDescription_default_instance_;
      }
      pRVar1 = (((ModelDescription *)puVar8)->input_).super_RepeatedPtrFieldBase.rep_;
      ppvVar23 = pRVar1->elements;
      if (pRVar1 == (Rep *)0x0) {
        ppvVar23 = (void **)0x0;
      }
      lVar30 = (long)(((ModelDescription *)puVar8)->input_).super_RepeatedPtrFieldBase.current_size_
      ;
      local_70 = ppvVar21;
      if (lVar30 != 0) {
        lVar28 = 0;
        do {
          pFVar3 = *(FeatureDescription **)((long)ppvVar23 + lVar28);
          iVar10 = std::
                   _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)local_68,
                          (key_type *)((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe)
                         );
          if (iVar10.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
              ._M_cur == (__node_type *)0x0) {
            std::operator+(&local_148,"Pipeline: the input \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            puVar17 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar17) {
              local_168.field_2._M_allocated_capacity = *puVar17;
              local_168.field_2._8_8_ = puVar14[3];
            }
            else {
              local_168.field_2._M_allocated_capacity = *puVar17;
              local_168._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_168._M_string_length = puVar14[1];
            *puVar14 = puVar17;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            puVar8 = (undefined1 *)model_00->description_;
            if ((ModelDescription *)puVar8 == (ModelDescription *)0x0) {
              puVar8 = Specification::_ModelDescription_default_instance_;
            }
            Specification::ModelDescription::GetTypeName_abi_cxx11_
                      (&local_f8,(ModelDescription *)puVar8);
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              uVar26 = local_168.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_f8._M_string_length + local_168._M_string_length) {
              uVar26 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                uVar26 = local_f8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar26 < local_f8._M_string_length + local_168._M_string_length)
              goto LAB_00330702;
              puVar14 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_f8,0,(char *)0x0,(ulong)local_168._M_dataplus._M_p)
              ;
            }
            else {
LAB_00330702:
              puVar14 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_168,(ulong)local_f8._M_dataplus._M_p);
            }
            puVar17 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar17) {
              local_188.field_2._M_allocated_capacity = *puVar17;
              local_188.field_2._8_8_ = puVar14[3];
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            else {
              local_188.field_2._M_allocated_capacity = *puVar17;
              local_188._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_188._M_string_length = puVar14[1];
            *puVar14 = puVar17;
            puVar14[1] = 0;
            *(undefined1 *)puVar17 = 0;
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_188);
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar15 == paVar18) {
              local_118._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_118._8_8_ = plVar15[3];
              local_128._0_8_ = &local_118;
            }
            else {
              local_118._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_128._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar15;
            }
            local_128._8_8_ = plVar15[1];
            *plVar15 = (long)paVar18;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._0_8_ != &local_118) {
              operator_delete((void *)local_128._0_8_,local_118._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
              operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1
                             );
            }
            uVar26 = local_148.field_2._M_allocated_capacity;
            _Var27._M_p = local_148._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar19) {
LAB_00330ace:
              operator_delete(_Var27._M_p,uVar26 + 1);
            }
LAB_00330ad6:
            bVar5 = true;
            goto LAB_00330adb;
          }
          bVar5 = Specification::isEquivalent
                            (pFVar3,*(FeatureDescription **)
                                     ((long)iVar10.
                                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                                            ._M_cur + 0x28));
          if (!bVar5) {
            std::operator+(&local_f8,"Pipeline: the input \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_f8);
            puVar17 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar17) {
              local_148.field_2._M_allocated_capacity = *puVar17;
              local_148.field_2._8_8_ = puVar14[3];
              local_148._M_dataplus._M_p = (pointer)paVar19;
            }
            else {
              local_148.field_2._M_allocated_capacity = *puVar17;
              local_148._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_148._M_string_length = puVar14[1];
            *puVar14 = puVar17;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            puVar8 = (undefined1 *)model_00->description_;
            if ((ModelDescription *)puVar8 == (ModelDescription *)0x0) {
              puVar8 = Specification::_ModelDescription_default_instance_;
            }
            Specification::ModelDescription::GetTypeName_abi_cxx11_
                      (&local_d8,(ModelDescription *)puVar8);
            uVar26 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar19) {
              uVar26 = local_148.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar26 < local_d8._M_string_length + local_148._M_string_length) {
              uVar26 = 0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                uVar26 = local_d8.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar26 < local_d8._M_string_length + local_148._M_string_length)
              goto LAB_003307b4;
              puVar14 = (undefined8 *)
                        std::__cxx11::string::replace
                                  ((ulong)&local_d8,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p)
              ;
            }
            else {
LAB_003307b4:
              puVar14 = (undefined8 *)
                        std::__cxx11::string::_M_append
                                  ((char *)&local_148,(ulong)local_d8._M_dataplus._M_p);
            }
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            puVar17 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar17) {
              local_168.field_2._M_allocated_capacity = *puVar17;
              local_168.field_2._8_8_ = puVar14[3];
            }
            else {
              local_168.field_2._M_allocated_capacity = *puVar17;
              local_168._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_168._M_string_length = puVar14[1];
            *puVar14 = puVar17;
            puVar14[1] = 0;
            *(undefined1 *)puVar17 = 0;
            puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
            puVar17 = puVar14 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar14 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar17) {
              local_188.field_2._M_allocated_capacity = *puVar17;
              local_188.field_2._8_8_ = puVar14[3];
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            else {
              local_188.field_2._M_allocated_capacity = *puVar17;
              local_188._M_dataplus._M_p = (pointer)*puVar14;
            }
            local_188._M_string_length = puVar14[1];
            *puVar14 = puVar17;
            puVar14[1] = 0;
            *(undefined1 *)(puVar14 + 2) = 0;
            plVar15 = (long *)std::__cxx11::string::append((char *)&local_188);
            paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(plVar15 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar15 == paVar18) {
              local_118._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_118._8_8_ = plVar15[3];
              local_128._0_8_ = &local_118;
            }
            else {
              local_118._M_allocated_capacity = paVar18->_M_allocated_capacity;
              local_128._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*plVar15;
            }
            local_128._8_8_ = plVar15[1];
            *plVar15 = (long)paVar18;
            plVar15[1] = 0;
            *(undefined1 *)(plVar15 + 2) = 0;
            Result::Result(__return_storage_ptr__,TYPE_MISMATCH,(string *)local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._0_8_ != &local_118) {
              operator_delete((void *)local_128._0_8_,local_118._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar19) {
              operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1
                             );
            }
            uVar26 = local_f8.field_2._M_allocated_capacity;
            _Var27._M_p = local_f8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f8._M_dataplus._M_p != &local_f8.field_2) goto LAB_00330ace;
            goto LAB_00330ad6;
          }
          lVar28 = lVar28 + 8;
        } while (lVar30 * 8 != lVar28);
      }
      Model::validate(__return_storage_ptr__,model_00);
      bVar6 = Result::good(__return_storage_ptr__);
      bVar5 = true;
      if (bVar6) {
        puVar8 = (undefined1 *)model_00->description_;
        if ((ModelDescription *)puVar8 == (ModelDescription *)0x0) {
          puVar8 = Specification::_ModelDescription_default_instance_;
        }
        pRVar1 = (((ModelDescription *)puVar8)->output_).super_RepeatedPtrFieldBase.rep_;
        ppvVar21 = pRVar1->elements;
        if (pRVar1 == (Rep *)0x0) {
          ppvVar21 = (void **)0x0;
        }
        lVar30 = (long)(((ModelDescription *)puVar8)->output_).super_RepeatedPtrFieldBase.
                       current_size_;
        bVar5 = false;
        if (lVar30 != 0) {
          lVar28 = 0;
          do {
            pFVar2 = *(mapped_type *)((long)ppvVar21 + lVar28);
            ppFVar9 = std::__detail::
                      _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_68,
                                   (key_type *)
                                   ((ulong)(pFVar2->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
            *ppFVar9 = pFVar2;
            lVar28 = lVar28 + 8;
            bVar5 = false;
          } while (lVar30 * 8 != lVar28);
        }
      }
      if ((bVar6) &&
         (plVar15 = (long *)(__return_storage_ptr__->m_message)._M_dataplus._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)plVar15 != local_a8)) {
        operator_delete(plVar15,local_a8->_M_allocated_capacity + 1);
      }
LAB_00330adb:
      if (bVar5) goto LAB_00331927;
      ppvVar21 = local_70 + 1;
    } while (ppvVar21 != local_78);
  }
  puVar8 = (undefined1 *)local_80->description_;
  if ((ModelDescription *)puVar8 == (ModelDescription *)0x0) {
    puVar8 = Specification::_ModelDescription_default_instance_;
  }
  pRVar1 = (((ModelDescription *)puVar8)->output_).super_RepeatedPtrFieldBase.rep_;
  ppvVar21 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar21 = (void **)0x0;
  }
  lVar30 = (long)(((ModelDescription *)puVar8)->output_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar30 != 0) {
    lVar28 = 0;
    do {
      pFVar3 = *(FeatureDescription **)((long)ppvVar21 + lVar28);
      iVar10 = std::
               _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)local_68,
                      (key_type *)((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
      if (iVar10.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
          ._M_cur == (__node_type *)0x0) {
        std::operator+(&local_188,"Pipeline output \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_188);
        local_128._0_8_ = &local_118;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 == paVar19) {
          local_118._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_118._8_8_ = plVar15[3];
        }
        else {
          local_118._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_128._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar15;
        }
        local_128._8_8_ = plVar15[1];
        *plVar15 = (long)paVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_128);
LAB_003312bd:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._0_8_ != &local_118) {
          operator_delete((void *)local_128._0_8_,local_118._M_allocated_capacity + 1);
        }
        uVar26 = local_188.field_2._M_allocated_capacity;
        _Var27._M_p = local_188._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p == &local_188.field_2) goto LAB_00331927;
        goto LAB_003312f3;
      }
      bVar5 = Specification::isEquivalent
                        (pFVar3,*(FeatureDescription **)
                                 ((long)iVar10.
                                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_true>
                                        ._M_cur + 0x28));
      if (!bVar5) {
        std::operator+(&local_188,"Type of pipeline output \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((ulong)(pFVar3->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        plVar15 = (long *)std::__cxx11::string::append((char *)&local_188);
        local_128._0_8_ = &local_118;
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar15 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar15 == paVar19) {
          local_118._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_118._8_8_ = plVar15[3];
        }
        else {
          local_118._M_allocated_capacity = paVar19->_M_allocated_capacity;
          local_128._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar15;
        }
        local_128._8_8_ = plVar15[1];
        *plVar15 = (long)paVar19;
        plVar15[1] = 0;
        *(undefined1 *)(plVar15 + 2) = 0;
        Result::Result(__return_storage_ptr__,TYPE_MISMATCH,(string *)local_128);
        goto LAB_003312bd;
      }
      lVar28 = lVar28 + 8;
    } while (lVar30 * 8 != lVar28);
  }
  this = &local_b8->models_;
  uVar29 = (uint)local_b0;
  if (local_80->isupdatable_ == false) {
    if (0 < (int)uVar29) {
      uVar24 = 0;
      do {
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                            (&this->super_RepeatedPtrFieldBase,uVar24);
        Specification::Model::Model((Model *)local_128,pTVar11);
        if (local_118._M_local_buf[0xc] == '\x01') {
          uVar29 = 1;
          if (uVar24 < 10) goto LAB_003316db;
          uVar22 = (ulong)uVar24;
          uVar25 = 4;
          goto LAB_00331217;
        }
        Specification::Model::~Model((Model *)local_128);
        uVar24 = uVar24 + 1;
      } while (uVar29 != uVar24);
    }
  }
  else {
    if (1 < (int)uVar29) {
      uVar24 = 0;
      do {
        pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                            (&this->super_RepeatedPtrFieldBase,uVar24);
        Specification::Model::Model((Model *)local_128,pTVar11);
        if (local_118._M_local_buf[0xc] == '\x01') {
          uVar29 = 1;
          if (uVar24 < 10) goto LAB_003317de;
          uVar22 = (ulong)uVar24;
          uVar25 = 4;
          goto LAB_0033131c;
        }
        Specification::Model::~Model((Model *)local_128);
        uVar24 = uVar24 + 1;
      } while (uVar29 - 1 != uVar24);
    }
    pTVar11 = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                        (&this->super_RepeatedPtrFieldBase,uVar29 - 1);
    if (pTVar11->isupdatable_ == false) {
      local_128._0_8_ = &local_118;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_128,
                 "Last model in an updatable pipeline model should be marked as updatable.","");
      Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,
                     (string *)local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ != &local_118) {
        operator_delete((void *)local_128._0_8_,local_118._M_allocated_capacity + 1);
      }
      goto LAB_00331927;
    }
  }
  uVar24 = (local_b8->names_).super_RepeatedPtrFieldBase.current_size_;
  if (0 < (int)uVar24) {
    if (uVar24 != uVar29) {
      uVar29 = 1;
      if (9 < uVar24) {
        uVar25 = uVar24;
        uVar16 = 4;
        do {
          uVar29 = uVar16;
          if (uVar25 < 100) {
            uVar29 = uVar29 - 2;
            goto LAB_00331376;
          }
          if (uVar25 < 1000) {
            uVar29 = uVar29 - 1;
            goto LAB_00331376;
          }
          if (uVar25 < 10000) goto LAB_00331376;
          bVar5 = 99999 < uVar25;
          uVar25 = uVar25 / 10000;
          uVar16 = uVar29 + 4;
        } while (bVar5);
        uVar29 = uVar29 + 1;
      }
LAB_00331376:
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_f8,(char)uVar29);
      std::__detail::__to_chars_10_impl<unsigned_int>(local_f8._M_dataplus._M_p,uVar29,uVar24);
      puVar14 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x3de576)
      ;
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      puVar17 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_148.field_2._M_allocated_capacity = *puVar17;
        local_148.field_2._8_8_ = puVar14[3];
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar17;
        local_148._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_148._M_string_length = puVar14[1];
      *puVar14 = puVar17;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
      paVar19 = &local_168.field_2;
      puVar17 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_168.field_2._M_allocated_capacity = *puVar17;
        local_168.field_2._8_8_ = puVar14[3];
        local_168._M_dataplus._M_p = (pointer)paVar19;
      }
      else {
        local_168.field_2._M_allocated_capacity = *puVar17;
        local_168._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_168._M_string_length = puVar14[1];
      *puVar14 = puVar17;
      puVar14[1] = 0;
      *(undefined1 *)(puVar14 + 2) = 0;
      uVar24 = (uint)local_b0;
      uVar29 = -uVar24;
      if (0 < (int)uVar24) {
        uVar29 = uVar24;
      }
      uVar24 = 1;
      if (9 < uVar29) {
        uVar22 = (ulong)uVar29;
        uVar25 = 4;
        do {
          uVar24 = uVar25;
          uVar16 = (uint)uVar22;
          if (uVar16 < 100) {
            uVar24 = uVar24 - 2;
            goto LAB_003314c4;
          }
          if (uVar16 < 1000) {
            uVar24 = uVar24 - 1;
            goto LAB_003314c4;
          }
          if (uVar16 < 10000) goto LAB_003314c4;
          uVar22 = uVar22 / 10000;
          uVar25 = uVar24 + 4;
        } while (99999 < uVar16);
        uVar24 = uVar24 + 1;
      }
LAB_003314c4:
      uVar22 = local_b0 >> 0x1f & 1;
      paVar18 = &local_d8.field_2;
      local_d8._M_dataplus._M_p = (pointer)paVar18;
      std::__cxx11::string::_M_construct((ulong)&local_d8,(char)uVar24 + (char)uVar22);
      std::__detail::__to_chars_10_impl<unsigned_int>
                (local_d8._M_dataplus._M_p + uVar22,uVar24,uVar29);
      uVar26 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar19) {
        uVar26 = local_168.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar26 < local_d8._M_string_length + local_168._M_string_length) {
        uVar26 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != paVar18) {
          uVar26 = local_d8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar26 < local_d8._M_string_length + local_168._M_string_length)
        goto LAB_0033154f;
        puVar14 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_d8,0,(char *)0x0,(ulong)local_168._M_dataplus._M_p);
      }
      else {
LAB_0033154f:
        puVar14 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_168,(ulong)local_d8._M_dataplus._M_p);
      }
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      puVar17 = puVar14 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar17) {
        local_188.field_2._M_allocated_capacity = *puVar17;
        local_188.field_2._8_8_ = puVar14[3];
      }
      else {
        local_188.field_2._M_allocated_capacity = *puVar17;
        local_188._M_dataplus._M_p = (pointer)*puVar14;
      }
      local_188._M_string_length = puVar14[1];
      *puVar14 = puVar17;
      puVar14[1] = 0;
      *(undefined1 *)puVar17 = 0;
      plVar15 = (long *)std::__cxx11::string::append((char *)&local_188);
      paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar15 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar15 == paVar20) {
        local_118._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_118._8_8_ = plVar15[3];
        local_128._0_8_ = &local_118;
      }
      else {
        local_118._M_allocated_capacity = paVar20->_M_allocated_capacity;
        local_128._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar15;
      }
      local_128._8_8_ = plVar15[1];
      *plVar15 = (long)paVar20;
      plVar15[1] = 0;
      *(undefined1 *)(plVar15 + 2) = 0;
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._0_8_ != &local_118) {
        operator_delete((void *)local_128._0_8_,local_118._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar18) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar19) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      uVar26 = local_f8.field_2._M_allocated_capacity;
      _Var27._M_p = local_f8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
LAB_003312f3:
        operator_delete(_Var27._M_p,uVar26 + 1);
      }
      goto LAB_00331927;
    }
    local_118._8_8_ = local_128 + 8;
    local_128._8_8_ = local_128._8_8_ & 0xffffffff00000000;
    uVar29 = 0;
    local_118._M_allocated_capacity = 0;
    local_100 = 0;
    local_b8 = (Pipeline *)&local_b8->names_;
    local_108.pipelineclassifier_ = (PipelineClassifier *)local_118._8_8_;
    do {
      pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                          ((RepeatedPtrFieldBase *)local_b8,uVar29);
      pcVar4 = (pTVar12->_M_dataplus)._M_p;
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pcVar4,pcVar4 + pTVar12->_M_string_length);
      iVar13 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_128,&local_188);
      if (iVar13._M_node == (_Base_ptr)(local_128 + 8)) {
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_128,&local_188);
      }
      else {
        std::operator+(&local_d8,"Pipeline model name \'",&local_188);
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        puVar17 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_f8.field_2._M_allocated_capacity = *puVar17;
          local_f8.field_2._8_8_ = puVar14[3];
        }
        else {
          local_f8.field_2._M_allocated_capacity = *puVar17;
          local_f8._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_f8._M_string_length = puVar14[1];
        *puVar14 = puVar17;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        uVar25 = 1;
        if (9 < uVar29) {
          uVar16 = 4;
          uVar7 = uVar29;
          do {
            uVar25 = uVar16;
            if (uVar7 < 100) {
              uVar25 = uVar25 - 2;
              goto LAB_00330e7b;
            }
            if (uVar7 < 1000) {
              uVar25 = uVar25 - 1;
              goto LAB_00330e7b;
            }
            if (uVar7 < 10000) goto LAB_00330e7b;
            bVar5 = 99999 < uVar7;
            uVar16 = uVar25 + 4;
            uVar7 = uVar7 / 10000;
          } while (bVar5);
          uVar25 = uVar25 + 1;
        }
LAB_00330e7b:
        local_a0 = local_90;
        std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar25);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_a0,uVar25,uVar29);
        uVar26 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          uVar26 = local_f8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar26 < local_98 + local_f8._M_string_length) {
          uVar22 = 0xf;
          if (local_a0 != local_90) {
            uVar22 = local_90[0];
          }
          if (uVar22 < local_98 + local_f8._M_string_length) goto LAB_00330f15;
          puVar14 = (undefined8 *)
                    std::__cxx11::string::replace
                              ((ulong)&local_a0,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
        }
        else {
LAB_00330f15:
          puVar14 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_a0)
          ;
        }
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        puVar17 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_148.field_2._M_allocated_capacity = *puVar17;
          local_148.field_2._8_8_ = puVar14[3];
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar17;
          local_148._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_148._M_string_length = puVar14[1];
        *puVar14 = puVar17;
        puVar14[1] = 0;
        *(undefined1 *)puVar17 = 0;
        puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        puVar17 = puVar14 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar17) {
          local_168.field_2._M_allocated_capacity = *puVar17;
          local_168.field_2._8_8_ = puVar14[3];
        }
        else {
          local_168.field_2._M_allocated_capacity = *puVar17;
          local_168._M_dataplus._M_p = (pointer)*puVar14;
        }
        local_168._M_string_length = puVar14[1];
        *puVar14 = puVar17;
        puVar14[1] = 0;
        *(undefined1 *)(puVar14 + 2) = 0;
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_168);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
        }
        if (local_a0 != local_90) {
          operator_delete(local_a0,local_90[0] + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if (iVar13._M_node != (_Base_ptr)(local_128 + 8)) {
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_128);
        goto LAB_00331927;
      }
      uVar29 = uVar29 + 1;
    } while (uVar29 != uVar24);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_128);
  }
  Result::Result(__return_storage_ptr__);
  goto LAB_00331927;
  while( true ) {
    if (uVar16 < 10000) goto LAB_003316db;
    uVar22 = uVar22 / 10000;
    uVar25 = uVar29 + 4;
    if (uVar16 < 100000) break;
LAB_00331217:
    uVar29 = uVar25;
    uVar16 = (uint)uVar22;
    if (uVar16 < 100) {
      uVar29 = uVar29 - 2;
      goto LAB_003316db;
    }
    if (uVar16 < 1000) {
      uVar29 = uVar29 - 1;
      goto LAB_003316db;
    }
  }
  uVar29 = uVar29 + 1;
LAB_003316db:
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_148,(char)uVar29);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_148._M_dataplus._M_p,uVar29,uVar24);
  puVar14 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,0x3de535);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  puVar17 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar17) {
    local_168.field_2._M_allocated_capacity = *puVar17;
    local_168.field_2._8_8_ = puVar14[3];
  }
  else {
    local_168.field_2._M_allocated_capacity = *puVar17;
    local_168._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_168._M_string_length = puVar14[1];
  *puVar14 = puVar17;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  puVar17 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar17) {
    local_188.field_2._M_allocated_capacity = *puVar17;
    local_188.field_2._8_8_ = puVar14[3];
  }
  else {
    local_188.field_2._M_allocated_capacity = *puVar17;
    local_188._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_188._M_string_length = puVar14[1];
  *puVar14 = puVar17;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_188);
  goto LAB_003318d3;
  while( true ) {
    if (uVar16 < 10000) goto LAB_003317de;
    uVar22 = uVar22 / 10000;
    uVar25 = uVar29 + 4;
    if (uVar16 < 100000) break;
LAB_0033131c:
    uVar29 = uVar25;
    uVar16 = (uint)uVar22;
    if (uVar16 < 100) {
      uVar29 = uVar29 - 2;
      goto LAB_003317de;
    }
    if (uVar16 < 1000) {
      uVar29 = uVar29 - 1;
      goto LAB_003317de;
    }
  }
  uVar29 = uVar29 + 1;
LAB_003317de:
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_148,(char)uVar29);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_148._M_dataplus._M_p,uVar29,uVar24);
  puVar14 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_148,0,(char *)0x0,0x3de488);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  puVar17 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar17) {
    local_168.field_2._M_allocated_capacity = *puVar17;
    local_168.field_2._8_8_ = puVar14[3];
  }
  else {
    local_168.field_2._M_allocated_capacity = *puVar17;
    local_168._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_168._M_string_length = puVar14[1];
  *puVar14 = puVar17;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  puVar14 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  puVar17 = puVar14 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar14 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar17) {
    local_188.field_2._M_allocated_capacity = *puVar17;
    local_188.field_2._8_8_ = puVar14[3];
  }
  else {
    local_188.field_2._M_allocated_capacity = *puVar17;
    local_188._M_dataplus._M_p = (pointer)*puVar14;
  }
  local_188._M_string_length = puVar14[1];
  *puVar14 = puVar17;
  puVar14[1] = 0;
  *(undefined1 *)(puVar14 + 2) = 0;
  Result::Result(__return_storage_ptr__,INVALID_UPDATABLE_MODEL_CONFIGURATION,&local_188);
LAB_003318d3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  Specification::Model::~Model((Model *)local_128);
LAB_00331927:
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_CoreML::Specification::FeatureDescription_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_68);
  return __return_storage_ptr__;
}

Assistant:

static Result validate(const Specification::Model& spec, const Specification::Pipeline& pipelineParams) {
        const int nModels = pipelineParams.models_size();
        if (nModels == 0) {
            // empty chain is not allowed
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Pipeline must contain one or more models.");
        }

        // build a type table from the list of models
        std::unordered_map<std::string, const CoreML::Specification::FeatureDescription*> typeTable;

        // First, populate the type table with the given inputs from the pipeline
        for(const auto& input : spec.description().input() ) {
            typeTable[input.name()] = &input;
        }

        // iterate over models and check the types at each one, making sure they match up with previous versions.
        for (const auto& model : pipelineParams.models()) {
            const auto& inputs = model.description().input();

            // validate current transform against previously known valid state
            for (const CoreML::Specification::FeatureDescription& arg : inputs) {

                auto it = typeTable.find(arg.name());

                if(it == typeTable.end()) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  ("Pipeline: the input '" + arg.name() + "' of model '" + model.description().GetTypeName()
                                   + "' does not present in pipeline input or previous model."));
                }

                if(!CoreML::Specification::isEquivalent(arg, *(it->second))) {
                    return Result(ResultType::TYPE_MISMATCH,
                                  ("Pipeline: the input '" + arg.name() + "' of model '" + model.description().GetTypeName()
                                   + "' does not match the type previously specified by the pipeline input or the output of a previous model."
                                   + " For the second case, make sure the input and previous model's output has the matching name and shapes."));
                }
            }

            // validate the model itself and bail out if it's invalid
            Result r = Model::validate(model);
            if (!r.good()) { return r; }

            // Now add in the outputs of this model to the mix.
            const auto& outputs = model.description().output();
            for (const CoreML::Specification::FeatureDescription& arg : outputs) {
                typeTable[arg.name()] = &arg;
            }
        }

        // Finally, validate that the outputs of the pipeline model match what is outputted by the models.
        for(const auto& output : spec.description().output() ) {
            auto it = typeTable.find(output.name());

            if(it == typeTable.end()) {

                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              ("Pipeline output '" + output.name() + "' not present in pipeline input or a contained model."));
            }

            if(!CoreML::Specification::isEquivalent(output, *(it->second))) {
                return Result(ResultType::TYPE_MISMATCH,
                              ("Type of pipeline output '" + output.name() + "' does not match type produced in pipeline input."));
            }
        }
        
        if (spec.isupdatable()) {
            for (int modelIdx = 0; modelIdx < nModels - 1; modelIdx++) {
                auto model = pipelineParams.models(modelIdx);
                if (model.isupdatable()) {
                    return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                                  ("Only the last model in the pipeline can be updatable. Model at position '" + std::to_string(modelIdx) + "' is marked as updatable."));
                }
            }
            if (false == pipelineParams.models(nModels - 1).isupdatable()) {
                return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                              ("Last model in an updatable pipeline model should be marked as updatable."));
            }
        } else {
            for (int modelIdx = 0; modelIdx < nModels; modelIdx++) {
                auto model = pipelineParams.models(modelIdx);
                if (model.isupdatable()) {
                    return Result(ResultType::INVALID_UPDATABLE_MODEL_CONFIGURATION,
                                  ("Found an updatable model at '" + std::to_string(modelIdx) + "' inside a non-updatable pipeline."));
                }
            }
        }

        const int nNames = pipelineParams.names_size();
        if (nNames > 0) {
            if (nNames != nModels) {
                return Result(ResultType::INVALID_MODEL_PARAMETERS,
                              ("The number of pipeline model names '" + std::to_string(nNames) +
                               "' doesn't match the number of models '" + std::to_string(nModels) + "'"));
            }
            std::set<std::string> names;
            for (int modelIdx = 0; modelIdx < nNames; modelIdx++) {
                auto modelName = pipelineParams.names(modelIdx);
                if (names.find(modelName) != names.end()) {
                    return Result(ResultType::INVALID_MODEL_PARAMETERS,
                                  ("Pipeline model name '" + modelName +
                                   "' at index '" +std::to_string(modelIdx) + " has already been used for previous models"));
                }
                names.insert(modelName);
            }

        }
        // if we get here, no input of any model caused a type mismatch with
        // any other prior model in the chain, or had an independent validation
        // error on its own.
        return Result();
    }